

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void mi_arena_purge(mi_arena_t *arena,size_t bitmap_idx,size_t blocks)

{
  _Bool _Var1;
  byte bVar2;
  size_t stat_size;
  void *p_00;
  size_t in_RDX;
  size_t already_committed;
  _Bool needs_recommit;
  void *p;
  size_t size;
  mi_bitmap_index_t in_stack_00000088;
  size_t in_stack_00000090;
  size_t in_stack_00000098;
  mi_bitmap_t in_stack_000000a0;
  size_t in_stack_ffffffffffffffb8;
  mi_arena_t *in_stack_ffffffffffffffc0;
  size_t bcount;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  
  stat_size = mi_arena_block_size(in_RDX);
  p_00 = mi_arena_block_start(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  bcount = 0;
  _Var1 = _mi_bitmap_is_claimed_across
                    ((mi_bitmap_t)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),0,
                     (size_t)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(size_t *)0xaf42e8)
  ;
  if (_Var1) {
    bVar2 = _mi_os_purge(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    mi_arena_block_size(bcount);
    bVar2 = _mi_os_purge_ex(p_00,CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                            SUB81(bcount >> 0x38,0),stat_size);
  }
  _mi_bitmap_unclaim_across(in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088)
  ;
  if ((bVar2 & 1) != 0) {
    _mi_bitmap_unclaim_across
              (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088);
  }
  return;
}

Assistant:

static void mi_arena_purge(mi_arena_t* arena, size_t bitmap_idx, size_t blocks) {
  mi_assert_internal(arena->blocks_committed != NULL);
  mi_assert_internal(arena->blocks_purge != NULL);
  mi_assert_internal(!arena->memid.is_pinned);
  const size_t size = mi_arena_block_size(blocks);
  void* const p = mi_arena_block_start(arena, bitmap_idx);
  bool needs_recommit;
  size_t already_committed = 0;
  if (_mi_bitmap_is_claimed_across(arena->blocks_committed, arena->field_count, blocks, bitmap_idx, &already_committed)) {
    // all blocks are committed, we can purge freely
    mi_assert_internal(already_committed == blocks);
    needs_recommit = _mi_os_purge(p, size);
  }
  else {
    // some blocks are not committed -- this can happen when a partially committed block is freed
    // in `_mi_arena_free` and it is conservatively marked as uncommitted but still scheduled for a purge
    // we need to ensure we do not try to reset (as that may be invalid for uncommitted memory).
    mi_assert_internal(already_committed < blocks);
    mi_assert_internal(mi_option_is_enabled(mi_option_purge_decommits));
    needs_recommit = _mi_os_purge_ex(p, size, false /* allow reset? */, mi_arena_block_size(already_committed));    
  }

  // clear the purged blocks
  _mi_bitmap_unclaim_across(arena->blocks_purge, arena->field_count, blocks, bitmap_idx);
  // update committed bitmap
  if (needs_recommit) {
    _mi_bitmap_unclaim_across(arena->blocks_committed, arena->field_count, blocks, bitmap_idx);
  }
}